

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O2

void __thiscall leveldb::RecoveryTest::DeleteManifestFile(RecoveryTest *this)

{
  Env *pEVar1;
  Status SStack_1d8;
  string local_1d0;
  Tester local_1b0;
  
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0x6c);
  pEVar1 = this->env_;
  ManifestFileName_abi_cxx11_(&local_1d0,this);
  (*pEVar1->_vptr_Env[8])(&SStack_1d8,pEVar1,&local_1d0);
  test::Tester::IsOk(&local_1b0,&SStack_1d8);
  Status::~Status(&SStack_1d8);
  std::__cxx11::string::~string((string *)&local_1d0);
  test::Tester::~Tester(&local_1b0);
  return;
}

Assistant:

void DeleteManifestFile() { ASSERT_OK(env_->DeleteFile(ManifestFileName())); }